

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int arg_int_scanfn(arg_int *parent,char *argval)

{
  int iVar1;
  char *local_38;
  char *end;
  long val;
  char *pcStack_20;
  int errorcode;
  char *argval_local;
  arg_int *parent_local;
  
  val._4_4_ = 0;
  if (parent->count == (parent->hdr).maxcount) {
    val._4_4_ = 2;
  }
  else if (argval == (char *)0x0) {
    parent->count = parent->count + 1;
  }
  else {
    pcStack_20 = argval;
    argval_local = (char *)parent;
    end = (char *)strtol0X(argval,&local_38,'X',0x10);
    if ((((local_38 == pcStack_20) &&
         (end = (char *)strtol0X(pcStack_20,&local_38,'O',8), local_38 == pcStack_20)) &&
        (end = (char *)strtol0X(pcStack_20,&local_38,'B',2), local_38 == pcStack_20)) &&
       (end = (char *)strtol(pcStack_20,&local_38,10), local_38 == pcStack_20)) {
      return 3;
    }
    if ((0x7fffffff < (long)end) || ((long)end < -0x80000000)) {
      val._4_4_ = 4;
    }
    iVar1 = detectsuffix(local_38,"KB");
    if (iVar1 == 0) {
      iVar1 = detectsuffix(local_38,"MB");
      if (iVar1 == 0) {
        iVar1 = detectsuffix(local_38,"GB");
        if (iVar1 == 0) {
          iVar1 = detectsuffix(local_38,"");
          if (iVar1 == 0) {
            val._4_4_ = 3;
          }
        }
        else if (((long)end < 2) && (-3 < (long)end)) {
          end = (char *)((long)end << 0x1e);
        }
        else {
          val._4_4_ = 4;
        }
      }
      else {
        if (((long)end < 0x800) && (-0x801 < (long)end)) {
          end = (char *)((long)end << 0x14);
        }
        else {
          val._4_4_ = 4;
        }
      }
    }
    else {
      if (((long)end < 0x200000) && (-0x200001 < (long)end)) {
        end = (char *)((long)end << 10);
      }
      else {
        val._4_4_ = 4;
      }
    }
    if (val._4_4_ == 0) {
      iVar1 = *(int *)(argval_local + 0x60);
      *(int *)(argval_local + 0x60) = iVar1 + 1;
      *(undefined4 *)(*(long *)(argval_local + 0x68) + (long)iVar1 * 4) = end._0_4_;
    }
  }
  return val._4_4_;
}

Assistant:

static int arg_int_scanfn(struct arg_int* parent, const char* argval) {
    int errorcode = 0;

    if (parent->count == parent->hdr.maxcount) {
        /* maximum number of arguments exceeded */
        errorcode = ARG_ERR_MAXCOUNT;
    } else if (!argval) {
        /* a valid argument with no argument value was given. */
        /* This happens when an optional argument value was invoked. */
        /* leave parent arguiment value unaltered but still count the argument. */
        parent->count++;
    } else {
        long int val;
        const char* end;

        /* attempt to extract hex integer (eg: +0x123) from argval into val conversion */
        val = strtol0X(argval, &end, 'X', 16);
        if (end == argval) {
            /* hex failed, attempt octal conversion (eg +0o123) */
            val = strtol0X(argval, &end, 'O', 8);
            if (end == argval) {
                /* octal failed, attempt binary conversion (eg +0B101) */
                val = strtol0X(argval, &end, 'B', 2);
                if (end == argval) {
                    /* binary failed, attempt decimal conversion with no prefix (eg 1234) */
                    val = strtol(argval, (char**)&end, 10);
                    if (end == argval) {
                        /* all supported number formats failed */
                        return ARG_ERR_BADINT;
                    }
                }
            }
        }

        /* Safety check for integer overflow. WARNING: this check    */
        /* achieves nothing on machines where size(int)==size(long). */
        if (val > INT_MAX || val < INT_MIN)
            errorcode = ARG_ERR_OVERFLOW;

        /* Detect any suffixes (KB,MB,GB) and multiply argument value appropriately. */
        /* We need to be mindful of integer overflows when using such big numbers.   */
        if (detectsuffix(end, "KB")) /* kilobytes */
        {
            if (val > (INT_MAX / 1024) || val < (INT_MIN / 1024))
                errorcode = ARG_ERR_OVERFLOW; /* Overflow would occur if we proceed */
            else
                val *= 1024;                /* 1KB = 1024 */
        } else if (detectsuffix(end, "MB")) /* megabytes */
        {
            if (val > (INT_MAX / 1048576) || val < (INT_MIN / 1048576))
                errorcode = ARG_ERR_OVERFLOW; /* Overflow would occur if we proceed */
            else
                val *= 1048576;             /* 1MB = 1024*1024 */
        } else if (detectsuffix(end, "GB")) /* gigabytes */
        {
            if (val > (INT_MAX / 1073741824) || val < (INT_MIN / 1073741824))
                errorcode = ARG_ERR_OVERFLOW; /* Overflow would occur if we proceed */
            else
                val *= 1073741824; /* 1GB = 1024*1024*1024 */
        } else if (!detectsuffix(end, ""))
            errorcode = ARG_ERR_BADINT; /* invalid suffix detected */

        /* if success then store result in parent->ival[] array */
        if (errorcode == 0)
            parent->ival[parent->count++] = (int)val;
    }

    /* printf("%s:scanfn(%p,%p) returns %d\n",__FILE__,parent,argval,errorcode); */
    return errorcode;
}